

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_split_anything(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  t_atom *ptVar1;
  t_symbol *x_00;
  int iVar2;
  t_atom *to;
  t_atom *ptVar3;
  t_atom tStack_58;
  undefined1 auStack_48 [15];
  undefined1 local_39;
  t_atom *local_38;
  t_atom *local_30;
  t_atom *outv;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  t_list_split *x_local;
  
  ptVar3 = (t_atom *)auStack_48;
  outv = argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  if (argc + 1 < 100) {
    ptVar3 = &tStack_58 + -(long)argc;
    local_38 = ptVar3;
  }
  else {
    tStack_58.a_w.w_symbol = (t_symbol *)0x1c57a0;
    local_38 = (t_atom *)getbytes((long)(argc + 1) << 4);
  }
  local_30 = local_38;
  local_38->a_type = A_SYMBOL;
  (local_30->a_w).w_symbol = ptStack_18;
  iVar2 = argv_local._4_4_;
  ptVar1 = outv;
  to = local_30 + 1;
  ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c57d6;
  atoms_copy(iVar2,ptVar1,to);
  x_00 = s_local;
  ptVar1 = local_30;
  iVar2 = argv_local._4_4_ + 1;
  ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c57f0;
  list_split_list((t_list_split *)x_00,&s_list,iVar2,ptVar1);
  ptVar1 = local_30;
  local_39 = 1;
  if (99 < argv_local._4_4_ + 1) {
    iVar2 = argv_local._4_4_ + 1;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c5816;
    freebytes(ptVar1,(long)iVar2 << 4);
  }
  return;
}

Assistant:

static void list_split_anything(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    ATOMS_ALLOCA(outv, argc+1);
    SETSYMBOL(outv, s);
    atoms_copy(argc, argv, outv + 1);
    list_split_list(x, &s_list, argc+1, outv);
    ATOMS_FREEA(outv, argc+1);
}